

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  PmxModel x;
  istream is;
  filebuf fb;
  PmxModel local_348;
  long local_218 [2];
  ios_base local_208 [264];
  streambuf local_100 [240];
  
  if (argc == 2) {
    std::filebuf::filebuf(local_100);
    lVar1 = std::filebuf::open((char *)local_100,(_Ios_Openmode)argv[1]);
    if (lVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t open the ",0xf);
      poVar2 = std::operator<<((ostream *)&std::cout,argv[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", please check",0xe);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(-1);
    }
    std::istream::istream((istream *)local_218,local_100);
    local_348.model_name._M_dataplus._M_p = (pointer)&local_348.model_name.field_2;
    local_348.version = 0.0;
    local_348.setting.encoding = '\0';
    local_348.setting.uv = '\0';
    local_348.setting.vertex_index_size = '\0';
    local_348.setting.texture_index_size = '\0';
    local_348.setting.material_index_size = '\0';
    local_348.setting.bone_index_size = '\0';
    local_348.setting.morph_index_size = '\0';
    local_348.setting.rigidbody_index_size = '\0';
    local_348.model_name._M_string_length = 0;
    local_348.model_name.field_2._M_local_buf[0] = '\0';
    local_348.model_english_name._M_dataplus._M_p = (pointer)&local_348.model_english_name.field_2;
    local_348.model_english_name._M_string_length = 0;
    local_348.model_english_name.field_2._M_local_buf[0] = '\0';
    local_348.model_comment._M_dataplus._M_p = (pointer)&local_348.model_comment.field_2;
    local_348.model_comment._M_string_length = 0;
    local_348.model_comment.field_2._M_local_buf[0] = '\0';
    local_348.model_english_comment._M_dataplus._M_p =
         (pointer)&local_348.model_english_comment.field_2;
    local_348.model_english_comment._M_string_length = 0;
    local_348.model_english_comment.field_2._M_local_buf[0] = '\0';
    local_348.vertex_count = 0;
    local_348.vertices._M_t.
    super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
    super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>)0x0;
    local_348.index_count = 0;
    local_348.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
    local_348.texture_count = 0;
    local_348.textures._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
            )0x0;
    local_348.material_count = 0;
    local_348.materials._M_t.
    super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
    super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>)0x0;
    local_348.bone_count = 0;
    local_348.bones._M_t.super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>.
    _M_t.super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>)0x0;
    local_348.morph_count = 0;
    local_348.morphs._M_t.
    super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
    super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>)0x0;
    local_348.frame_count = 0;
    local_348.frames._M_t.
    super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
    super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>)0x0;
    local_348.rigid_body_count = 0;
    local_348.rigid_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
    super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>)0x0;
    local_348.joint_count = 0;
    local_348.joints._M_t.
    super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
    super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>)0x0;
    local_348.soft_body_count = 0;
    local_348.soft_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>)0x0;
    pmx::PmxModel::Read(&local_348,(istream *)local_218);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PMX version",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    poVar2 = std::ostream::_M_insert<double>((double)local_348.version);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model Name",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_348.model_name._M_dataplus._M_p,
                        local_348.model_name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Model English Name",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_348.model_english_name._M_dataplus._M_p,
                        local_348.model_english_name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comment",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_348.model_comment._M_dataplus._M_p,
                        local_348.model_comment._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"English Comment",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_348.model_english_comment._M_dataplus._M_p,
                        local_348.model_english_comment._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#vertex",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.vertex_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#index",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.index_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#texture",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.texture_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#material",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.material_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#bone",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.bone_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#morph",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.morph_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#frame",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.frame_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#rigid body",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.rigid_body_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#joint",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.joint_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#soft body",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    lVar1 = std::cout;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) =
         *(uint *)(__cxa_rethrow + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x80;
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_348.soft_body_count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    pmx::PmxModel::~PmxModel(&local_348);
    local_218[0] = _VTT;
    *(undefined8 *)((long)local_218 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
    local_218[1] = 0;
    std::ios_base::~ios_base(local_208);
    std::filebuf::~filebuf(local_100);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: ./demo [PMX file path]",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc != 2) {
        std::cout << "Usage: ./demo [PMX file path]" << std::endl;
        return 0;
    }
    std::filebuf fb;
    if(!fb.open(argv[1], std::ios::in | std::ios::binary)) {
        std::cout << "Can't open the " << argv[1] << ", please check" << std::endl;
        exit(-1);
    }

    std::istream is(&fb);
    pmx::PmxModel x;
    x.Read(&is);
    
    PRINT("PMX version", x.version)
    PRINT("Model Name", x.model_name)
    PRINT("Model English Name", x.model_english_name)
    PRINT("Comment", x.model_comment)
    PRINT("English Comment", x.model_english_comment)
    PRINT("#vertex", x.vertex_count)
    PRINT("#index", x.index_count)
    PRINT("#texture", x.texture_count)
    PRINT("#material", x.material_count)
    PRINT("#bone", x.bone_count)
    PRINT("#morph", x.morph_count)
    PRINT("#frame", x.frame_count)
    PRINT("#rigid body", x.rigid_body_count)
    PRINT("#joint", x.joint_count)
    PRINT("#soft body", x.soft_body_count)
}